

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_helper.c
# Opt level: O1

void arm_debug_excp_handler_aarch64(CPUState *cs)

{
  anon_union_16_2_aaf24f3d_for_entry *paVar1;
  CPUARMState_conflict *env;
  CPUWatchpoint *pCVar2;
  TranslationBlock *pTVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  TranslationBlock *pTVar7;
  uint uVar8;
  uint uVar9;
  uint32_t syndrome;
  uint32_t excp;
  uint uVar10;
  CPUBreakpoint *pCVar11;
  CPUBreakpoint *pCVar12;
  bool bVar13;
  
  env = (CPUARMState_conflict *)(cs[1].tb_jmp_cache + 0x40b);
  pCVar2 = cs->watchpoint_hit;
  if (pCVar2 != (CPUWatchpoint *)0x0) {
    uVar9 = pCVar2->flags;
    if ((uVar9 & 0x20) == 0) {
      return;
    }
    iVar4 = arm_debug_target_el(env);
    iVar5 = arm_current_el(env);
    cs->watchpoint_hit = (CPUWatchpoint *)0x0;
    uVar6 = arm_debug_exception_fsr(env);
    *(uint32_t *)((long)cs[1].tb_jmp_cache + 0x2c2c) = uVar6;
    cs[1].tb_jmp_cache[0x586] = (TranslationBlock *)pCVar2->hitaddr;
    syndrome = (uVar9 >> 1 & 0x40) + (uint)(iVar4 == iVar5) * 0x4000000 + 0xd2000022;
    uVar6 = arm_debug_target_el(env);
    excp = 4;
LAB_00610a3a:
    raise_exception_aarch64(env,excp,syndrome,uVar6);
  }
  iVar4 = *(int *)((long)cs[1].tb_jmp_cache + 0x21a4);
  if (iVar4 == 0) {
    pTVar7 = (TranslationBlock *)(ulong)*(uint *)((long)cs[1].tb_jmp_cache + 0x2094);
  }
  else {
    pTVar7 = cs[1].tb_jmp_cache[0x433];
  }
  pTVar3 = cs[1].tb_jmp_cache[0xa11];
  if (((ulong)pTVar3 >> 0x21 & 1) == 0) {
    bVar13 = false;
  }
  else {
    if (iVar4 == 0) {
      bVar13 = (*(uint *)((long)cs[1].tb_jmp_cache + 0x21ac) & 0x1f) == 0x16;
    }
    else {
      bVar13 = (~*(uint *)(cs[1].tb_jmp_cache + 0x434) & 0xc) == 0;
    }
    if (!bVar13) {
      bVar13 = ((ulong)cs[1].tb_jmp_cache[0x483] & 1) == 0;
    }
  }
  uVar9 = (uint)pTVar3;
  if ((((((ulong)pTVar3 >> 0x20 & 1) == 0) || (bVar13)) ||
      ((uVar8 = 2, (*(byte *)((long)cs[1].tb_jmp_cache + 0x2413) & 8) == 0 &&
       ((*(byte *)((long)cs[1].tb_jmp_cache + 0x2851) & 1) == 0)))) &&
     ((((ulong)pTVar3 >> 0x21 & 1) == 0 || (uVar8 = 3, !(bool)((uVar9 >> 0x1c & 1) == 0 & bVar13))))
     ) {
    uVar8 = 1;
  }
  if ((uVar9 >> 9 & 1) == 0) {
    if (iVar4 == 0) {
      uVar10 = *(uint *)((long)cs[1].tb_jmp_cache + 0x21ac) & 0x1f;
      if (uVar10 == 0x10) {
        uVar9 = 0;
      }
      else if (uVar10 == 0x16) {
        uVar9 = 3;
      }
      else if (uVar10 == 0x1a) {
        uVar9 = 2;
      }
      else {
        if (((ulong)pTVar3 >> 0x21 & 1) != 0) {
          bVar13 = uVar10 == 0x16;
          if (!bVar13) {
            bVar13 = ((ulong)cs[1].tb_jmp_cache[0x483] & 1) == 0;
          }
          if (((uVar9 >> 0x1c & 1) == 0) && (uVar9 = 3, bVar13)) goto LAB_00610b20;
        }
        uVar9 = 1;
      }
    }
    else {
      uVar9 = *(uint *)(cs[1].tb_jmp_cache + 0x434) >> 2 & 3;
    }
  }
  else {
    uVar9 = 1;
    if (*(int *)(cs[1].tb_jmp_cache + 0x579) == 0) {
      uVar9 = ~*(uint *)((long)cs[1].tb_jmp_cache +
                        (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b8c) & 1;
    }
  }
LAB_00610b20:
  pCVar11 = (cs->breakpoints).tqh_first;
  pCVar12 = pCVar11;
  if (pCVar11 != (CPUBreakpoint *)0x0) {
    do {
      if (((TranslationBlock *)pCVar12->pc == pTVar7) && ((pCVar12->flags & 0x10) != 0)) {
        return;
      }
      paVar1 = &pCVar12->entry;
      pCVar12 = paVar1->tqe_next;
    } while (paVar1->tqe_next != (CPUBreakpoint *)0x0);
    for (; pCVar11 != (CPUBreakpoint *)0x0; pCVar11 = (pCVar11->entry).tqe_next) {
      if (((TranslationBlock *)pCVar11->pc == pTVar7) && ((pCVar11->flags & 0x20) != 0)) {
        uVar6 = arm_debug_exception_fsr(env);
        *(uint32_t *)((long)cs[1].tb_jmp_cache + 0x2c2c) = uVar6;
        cs[1].tb_jmp_cache[0x586] = (TranslationBlock *)0x0;
        syndrome = (uint)(uVar8 == uVar9) << 0x1a | 0xc2000022;
        uVar6 = arm_debug_target_el(env);
        excp = 3;
        goto LAB_00610a3a;
      }
    }
  }
  return;
}

Assistant:

void arm_debug_excp_handler(CPUState *cs)
{
    /*
     * Called by core code when a watchpoint or breakpoint fires;
     * need to check which one and raise the appropriate exception.
     */
    ARMCPU *cpu = ARM_CPU(cs);
    CPUARMState *env = &cpu->env;
    CPUWatchpoint *wp_hit = cs->watchpoint_hit;

    if (wp_hit) {
        if (wp_hit->flags & BP_CPU) {
            bool wnr = (wp_hit->flags & BP_WATCHPOINT_HIT_WRITE) != 0;
            bool same_el = arm_debug_target_el(env) == arm_current_el(env);

            cs->watchpoint_hit = NULL;

            env->exception.fsr = arm_debug_exception_fsr(env);
            env->exception.vaddress = wp_hit->hitaddr;
            raise_exception(env, EXCP_DATA_ABORT,
                    syn_watchpoint(same_el, 0, wnr),
                    arm_debug_target_el(env));
        }
    } else {
        uint64_t pc = is_a64(env) ? env->pc : env->regs[15];
        bool same_el = (arm_debug_target_el(env) == arm_current_el(env));

        /*
         * (1) GDB breakpoints should be handled first.
         * (2) Do not raise a CPU exception if no CPU breakpoint has fired,
         * since singlestep is also done by generating a debug internal
         * exception.
         */
        if (cpu_breakpoint_test(cs, pc, BP_GDB)
            || !cpu_breakpoint_test(cs, pc, BP_CPU)) {
            return;
        }

        env->exception.fsr = arm_debug_exception_fsr(env);
        /*
         * FAR is UNKNOWN: clear vaddress to avoid potentially exposing
         * values to the guest that it shouldn't be able to see at its
         * exception/security level.
         */
        env->exception.vaddress = 0;
        raise_exception(env, EXCP_PREFETCH_ABORT,
                        syn_breakpoint(same_el),
                        arm_debug_target_el(env));
    }
}